

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_gfx_draw_mesh(rf_mesh mesh,rf_material material,rf_mat transform)

{
  rf_mat left;
  rf_shader shader;
  rf_shader shader_00;
  rf_shader shader_01;
  rf_mat right;
  rf_context *prVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  long lVar34;
  rf_int i_1;
  rf_material *prVar35;
  uint uVar36;
  uint uVar37;
  undefined1 *puVar38;
  rf_material_map *prVar39;
  rf_int i;
  byte bVar40;
  undefined8 in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe08;
  rf_mat mat_model_view;
  rf_mat mat_projection;
  rf_mat mat_view;
  rf_mat mat_mvp;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  rf_float16 buffer;
  
  bVar40 = 0;
  (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(material.shader.id);
  if (material.shader.locs[7] != -1) {
    prVar35 = &material;
    puVar38 = &stack0xfffffffffffffd88;
    for (lVar34 = 0x84; lVar34 != 0; lVar34 = lVar34 + -1) {
      *puVar38 = (char)(prVar35->shader).id;
      prVar35 = (rf_material *)((long)prVar35 + (ulong)bVar40 * -2 + 1);
      puVar38 = puVar38 + (ulong)bVar40 * -2 + 1;
    }
    shader.locs[1] = (int)in_stack_fffffffffffffd90;
    shader.locs[2] = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    shader.id = (int)in_stack_fffffffffffffd88;
    shader.locs[0] = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    shader.locs[3] = (int)in_stack_fffffffffffffd98;
    shader.locs[4] = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    shader.locs[5] = (int)in_stack_fffffffffffffda0;
    shader.locs[6] = (int)((ulong)in_stack_fffffffffffffda0 >> 0x20);
    shader.locs[7] = (int)in_stack_fffffffffffffda8;
    shader.locs[8] = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    shader.locs[9] = (int)in_stack_fffffffffffffdb0;
    shader.locs[10] = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
    shader.locs[0xb] = (int)in_stack_fffffffffffffdb8;
    shader.locs[0xc] = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
    shader.locs[0xd] = (int)in_stack_fffffffffffffdc0;
    shader.locs[0xe] = (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
    shader.locs[0xf] = (int)in_stack_fffffffffffffdc8;
    shader.locs[0x10] = (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    shader.locs[0x11] = (int)in_stack_fffffffffffffdd0;
    shader.locs[0x12] = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
    shader.locs[0x13] = (int)in_stack_fffffffffffffdd8;
    shader.locs[0x14] = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
    shader.locs[0x15] = (int)in_stack_fffffffffffffde0;
    shader.locs[0x16] = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    shader.locs[0x17] = (int)in_stack_fffffffffffffde8;
    shader.locs[0x18] = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
    shader.locs[0x19] = (int)in_stack_fffffffffffffdf0;
    shader.locs[0x1a] = (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
    shader.locs[0x1b] = (int)in_stack_fffffffffffffdf8;
    shader.locs[0x1c] = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
    shader.locs[0x1d] = (int)in_stack_fffffffffffffe00;
    shader.locs[0x1e] = (int)((ulong)in_stack_fffffffffffffe00 >> 0x20);
    shader.locs[0x1f] = in_stack_fffffffffffffe08;
    rf_gfx_set_shader_value_matrix(shader,material.shader.locs[7],transform);
  }
  if (material.shader.locs[0xb] != -1) {
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform4f)
              (material.shader.locs[0xb],(float)((material.maps)->color).r / 255.0,
               (float)((material.maps)->color).g / 255.0,(float)((material.maps)->color).b / 255.0,
               (float)((material.maps)->color).a / 255.0);
  }
  if (material.shader.locs[0xc] != -1) {
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform4f)
              (material.shader.locs[0xc],(float)material.maps[1].color.r / 255.0,
               (float)material.maps[1].color.g / 255.0,(float)material.maps[1].color.b / 255.0,
               (float)material.maps[1].color.a / 255.0);
  }
  if (material.shader.locs[8] != -1) {
    prVar35 = &material;
    puVar38 = &stack0xfffffffffffffd88;
    for (lVar34 = 0x84; lVar34 != 0; lVar34 = lVar34 + -1) {
      *puVar38 = (char)(prVar35->shader).id;
      prVar35 = (rf_material *)((long)prVar35 + (ulong)bVar40 * -2 + 1);
      puVar38 = puVar38 + (ulong)bVar40 * -2 + 1;
    }
    shader_00.locs[1] = (int)in_stack_fffffffffffffd90;
    shader_00.locs[2] = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    shader_00.id = (int)in_stack_fffffffffffffd88;
    shader_00.locs[0] = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    shader_00.locs[3] = (int)in_stack_fffffffffffffd98;
    shader_00.locs[4] = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    shader_00.locs[5] = (int)in_stack_fffffffffffffda0;
    shader_00.locs[6] = (int)((ulong)in_stack_fffffffffffffda0 >> 0x20);
    shader_00.locs[7] = (int)in_stack_fffffffffffffda8;
    shader_00.locs[8] = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    shader_00.locs[9] = (int)in_stack_fffffffffffffdb0;
    shader_00.locs[10] = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
    shader_00.locs[0xb] = (int)in_stack_fffffffffffffdb8;
    shader_00.locs[0xc] = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
    shader_00.locs[0xd] = (int)in_stack_fffffffffffffdc0;
    shader_00.locs[0xe] = (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
    shader_00.locs[0xf] = (int)in_stack_fffffffffffffdc8;
    shader_00.locs[0x10] = (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    shader_00.locs[0x11] = (int)in_stack_fffffffffffffdd0;
    shader_00.locs[0x12] = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
    shader_00.locs[0x13] = (int)in_stack_fffffffffffffdd8;
    shader_00.locs[0x14] = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
    shader_00.locs[0x15] = (int)in_stack_fffffffffffffde0;
    shader_00.locs[0x16] = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    shader_00.locs[0x17] = (int)in_stack_fffffffffffffde8;
    shader_00.locs[0x18] = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
    shader_00.locs[0x19] = (int)in_stack_fffffffffffffdf0;
    shader_00.locs[0x1a] = (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
    shader_00.locs[0x1b] = (int)in_stack_fffffffffffffdf8;
    shader_00.locs[0x1c] = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
    shader_00.locs[0x1d] = (int)in_stack_fffffffffffffe00;
    shader_00.locs[0x1e] = (int)((ulong)in_stack_fffffffffffffe00 >> 0x20);
    shader_00.locs[0x1f] = in_stack_fffffffffffffe08;
    rf_gfx_set_shader_value_matrix(shader_00,material.shader.locs[8],(rf__ctx->field_0).modelview);
  }
  if (material.shader.locs[9] != -1) {
    prVar35 = &material;
    puVar38 = &stack0xfffffffffffffd88;
    for (lVar34 = 0x84; lVar34 != 0; lVar34 = lVar34 + -1) {
      *puVar38 = (char)(prVar35->shader).id;
      prVar35 = (rf_material *)((long)prVar35 + (ulong)bVar40 * -2 + 1);
      puVar38 = puVar38 + (ulong)bVar40 * -2 + 1;
    }
    shader_01.locs[1] = (int)in_stack_fffffffffffffd90;
    shader_01.locs[2] = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    shader_01.id = (int)in_stack_fffffffffffffd88;
    shader_01.locs[0] = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    shader_01.locs[3] = (int)in_stack_fffffffffffffd98;
    shader_01.locs[4] = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    shader_01.locs[5] = (int)in_stack_fffffffffffffda0;
    shader_01.locs[6] = (int)((ulong)in_stack_fffffffffffffda0 >> 0x20);
    shader_01.locs[7] = (int)in_stack_fffffffffffffda8;
    shader_01.locs[8] = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    shader_01.locs[9] = (int)in_stack_fffffffffffffdb0;
    shader_01.locs[10] = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
    shader_01.locs[0xb] = (int)in_stack_fffffffffffffdb8;
    shader_01.locs[0xc] = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
    shader_01.locs[0xd] = (int)in_stack_fffffffffffffdc0;
    shader_01.locs[0xe] = (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
    shader_01.locs[0xf] = (int)in_stack_fffffffffffffdc8;
    shader_01.locs[0x10] = (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    shader_01.locs[0x11] = (int)in_stack_fffffffffffffdd0;
    shader_01.locs[0x12] = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
    shader_01.locs[0x13] = (int)in_stack_fffffffffffffdd8;
    shader_01.locs[0x14] = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
    shader_01.locs[0x15] = (int)in_stack_fffffffffffffde0;
    shader_01.locs[0x16] = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    shader_01.locs[0x17] = (int)in_stack_fffffffffffffde8;
    shader_01.locs[0x18] = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
    shader_01.locs[0x19] = (int)in_stack_fffffffffffffdf0;
    shader_01.locs[0x1a] = (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
    shader_01.locs[0x1b] = (int)in_stack_fffffffffffffdf8;
    shader_01.locs[0x1c] = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
    shader_01.locs[0x1d] = (int)in_stack_fffffffffffffe00;
    shader_01.locs[0x1e] = (int)((ulong)in_stack_fffffffffffffe00 >> 0x20);
    shader_01.locs[0x1f] = in_stack_fffffffffffffe08;
    rf_gfx_set_shader_value_matrix(shader_01,material.shader.locs[9],(rf__ctx->field_0).projection);
  }
  fVar18 = (rf__ctx->field_0).modelview.m0;
  fVar19 = (rf__ctx->field_0).modelview.m4;
  fVar20 = (rf__ctx->field_0).modelview.m8;
  fVar21 = (rf__ctx->field_0).modelview.m12;
  fVar22 = (rf__ctx->field_0).modelview.m1;
  fVar23 = (rf__ctx->field_0).modelview.m5;
  fVar24 = (rf__ctx->field_0).modelview.m9;
  fVar25 = (rf__ctx->field_0).modelview.m13;
  fVar26 = (rf__ctx->field_0).modelview.m2;
  fVar27 = (rf__ctx->field_0).modelview.m6;
  fVar28 = (rf__ctx->field_0).modelview.m10;
  fVar29 = (rf__ctx->field_0).modelview.m14;
  fVar30 = (rf__ctx->field_0).modelview.m3;
  fVar31 = (rf__ctx->field_0).modelview.m7;
  fVar32 = (rf__ctx->field_0).modelview.m11;
  fVar33 = (rf__ctx->field_0).modelview.m15;
  fVar14 = (rf__ctx->field_0).projection.m0;
  fVar15 = (rf__ctx->field_0).projection.m4;
  fVar16 = (rf__ctx->field_0).projection.m8;
  fVar17 = (rf__ctx->field_0).projection.m12;
  fVar10 = (rf__ctx->field_0).projection.m1;
  fVar11 = (rf__ctx->field_0).projection.m5;
  fVar12 = (rf__ctx->field_0).projection.m9;
  fVar13 = (rf__ctx->field_0).projection.m13;
  fVar6 = (rf__ctx->field_0).projection.m2;
  fVar7 = (rf__ctx->field_0).projection.m6;
  fVar8 = (rf__ctx->field_0).projection.m10;
  fVar9 = (rf__ctx->field_0).projection.m14;
  fVar2 = (rf__ctx->field_0).projection.m3;
  fVar3 = (rf__ctx->field_0).projection.m7;
  fVar4 = (rf__ctx->field_0).projection.m11;
  fVar5 = (rf__ctx->field_0).projection.m15;
  rf_mat_mul((rf__ctx->field_0).transform,(rf__ctx->field_0).modelview);
  right._8_8_ = uStack_a0;
  right._0_8_ = local_a8;
  right._16_8_ = local_98;
  right._24_8_ = uStack_90;
  right._32_8_ = local_88;
  right._40_8_ = uStack_80;
  right._48_8_ = local_78;
  right._56_8_ = uStack_70;
  rf_mat_mul(transform,right);
  prVar39 = material.maps;
  for (lVar34 = 0; lVar34 != 0xc; lVar34 = lVar34 + 1) {
    if ((prVar39->texture).id != 0) {
      uVar37 = (uint)lVar34;
      (*(rf__ctx->field_0).gfx_ctx.gl.ActiveTexture)(uVar37 + 0x84c0);
      uVar36 = 0xde1;
      if ((uVar37 & 0xe) == 8) {
        uVar36 = 0x8513;
      }
      if (lVar34 == 7) {
        uVar36 = 0x8513;
      }
      (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(uVar36,(prVar39->texture).id);
      (*(rf__ctx->field_0).gfx_ctx.gl.Uniform1i)(material.shader.locs[lVar34 + 0xe],uVar37);
    }
    prVar39 = prVar39 + 1;
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)(mesh.vao_id);
  prVar1 = rf__ctx;
  (prVar1->field_0).modelview.m3 = mat_model_view.m3;
  (prVar1->field_0).modelview.m7 = mat_model_view.m7;
  (prVar1->field_0).modelview.m11 = mat_model_view.m11;
  (prVar1->field_0).modelview.m15 = mat_model_view.m15;
  (prVar1->field_0).modelview.m2 = mat_model_view.m2;
  (prVar1->field_0).modelview.m6 = mat_model_view.m6;
  (prVar1->field_0).modelview.m10 = mat_model_view.m10;
  (prVar1->field_0).modelview.m14 = mat_model_view.m14;
  (prVar1->field_0).modelview.m1 = mat_model_view.m1;
  (prVar1->field_0).modelview.m5 = mat_model_view.m5;
  (prVar1->field_0).modelview.m9 = mat_model_view.m9;
  (prVar1->field_0).modelview.m13 = mat_model_view.m13;
  (prVar1->field_0).modelview.m0 = mat_model_view.m0;
  (prVar1->field_0).modelview.m4 = mat_model_view.m4;
  (prVar1->field_0).modelview.m8 = mat_model_view.m8;
  (prVar1->field_0).modelview.m12 = mat_model_view.m12;
  left._8_8_ = mat_model_view._8_8_;
  left._0_8_ = mat_model_view._0_8_;
  left._16_8_ = mat_model_view._16_8_;
  left._24_8_ = mat_model_view._24_8_;
  left._32_8_ = mat_model_view._32_8_;
  left._40_8_ = mat_model_view._40_8_;
  left._48_8_ = mat_model_view._48_8_;
  left._56_8_ = mat_model_view._56_8_;
  rf_mat_mul(left,(prVar1->field_0).projection);
  (*(prVar1->field_0).gfx_ctx.gl.UniformMatrix4fv)(material.shader.locs[6],1,'\0',buffer.v);
  if (mesh.indices == (unsigned_short *)0x0) {
    (*(rf__ctx->field_0).gfx_ctx.gl.DrawArrays)(4,0,mesh.vertex_count);
  }
  else {
    (*(rf__ctx->field_0).gfx_ctx.gl.DrawElements)(4,mesh.triangle_count * 3,0x1403,(void *)0x0);
  }
  for (lVar34 = 0; lVar34 != 0xc; lVar34 = lVar34 + 1) {
    (*(rf__ctx->field_0).gfx_ctx.gl.ActiveTexture)((uint)lVar34 + 0x84c0);
    uVar37 = 0xde1;
    if (((uint)lVar34 & 0xe) == 8) {
      uVar37 = 0x8513;
    }
    if (lVar34 == 7) {
      uVar37 = 0x8513;
    }
    (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(uVar37,0);
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)(0);
  (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(0);
  prVar1 = rf__ctx;
  (prVar1->field_0).projection.m3 = fVar2;
  (prVar1->field_0).projection.m7 = fVar3;
  (prVar1->field_0).projection.m11 = fVar4;
  (prVar1->field_0).projection.m15 = fVar5;
  (prVar1->field_0).projection.m2 = fVar6;
  (prVar1->field_0).projection.m6 = fVar7;
  (prVar1->field_0).projection.m10 = fVar8;
  (prVar1->field_0).projection.m14 = fVar9;
  (prVar1->field_0).projection.m1 = fVar10;
  (prVar1->field_0).projection.m5 = fVar11;
  (prVar1->field_0).projection.m9 = fVar12;
  (prVar1->field_0).projection.m13 = fVar13;
  (prVar1->field_0).projection.m0 = fVar14;
  (prVar1->field_0).projection.m4 = fVar15;
  (prVar1->field_0).projection.m8 = fVar16;
  (prVar1->field_0).projection.m12 = fVar17;
  (prVar1->field_0).modelview.m0 = fVar18;
  (prVar1->field_0).modelview.m4 = fVar19;
  (prVar1->field_0).modelview.m8 = fVar20;
  (prVar1->field_0).modelview.m12 = fVar21;
  (prVar1->field_0).modelview.m1 = fVar22;
  (prVar1->field_0).modelview.m5 = fVar23;
  (prVar1->field_0).modelview.m9 = fVar24;
  (prVar1->field_0).modelview.m13 = fVar25;
  (prVar1->field_0).modelview.m2 = fVar26;
  (prVar1->field_0).modelview.m6 = fVar27;
  (prVar1->field_0).modelview.m10 = fVar28;
  (prVar1->field_0).modelview.m14 = fVar29;
  (prVar1->field_0).modelview.m3 = fVar30;
  (prVar1->field_0).modelview.m7 = fVar31;
  (prVar1->field_0).modelview.m11 = fVar32;
  (prVar1->field_0).modelview.m15 = fVar33;
  return;
}

Assistant:

RF_API void rf_gfx_draw_mesh(rf_mesh mesh, rf_material material, rf_mat transform)
{
    // Bind shader program
    rf_gl.UseProgram(material.shader.id);

    // Matrices and other values required by shader
    //-----------------------------------------------------
    // Calculate and send to shader model matrix (used by PBR shader)
    if (material.shader.locs[RF_LOC_MATRIX_MODEL] != -1)
        rf_gfx_set_shader_value_matrix(material.shader, material.shader.locs[RF_LOC_MATRIX_MODEL], transform);

    // Upload to shader material.col_diffuse
    if (material.shader.locs[RF_LOC_COLOR_DIFFUSE] != -1)
        rf_gl.Uniform4f(material.shader.locs[RF_LOC_COLOR_DIFFUSE], (float)material.maps[RF_MAP_DIFFUSE].color.r / 255.0f,
                    (float)material.maps[RF_MAP_DIFFUSE].color.g / 255.0f,
                    (float)material.maps[RF_MAP_DIFFUSE].color.b / 255.0f,
                    (float)material.maps[RF_MAP_DIFFUSE].color.a / 255.0f);

    // Upload to shader material.colSpecular (if available)
    if (material.shader.locs[RF_LOC_COLOR_SPECULAR] != -1)
        rf_gl.Uniform4f(material.shader.locs[RF_LOC_COLOR_SPECULAR], (float)material.maps[RF_MAP_SPECULAR].color.r / 255.0f,
                    (float)material.maps[RF_MAP_SPECULAR].color.g / 255.0f,
                    (float)material.maps[RF_MAP_SPECULAR].color.b / 255.0f,
                    (float)material.maps[RF_MAP_SPECULAR].color.a / 255.0f);

    if (material.shader.locs[RF_LOC_MATRIX_VIEW] != -1)
        rf_gfx_set_shader_value_matrix(material.shader, material.shader.locs[RF_LOC_MATRIX_VIEW],
                                       rf_ctx.modelview);
    if (material.shader.locs[RF_LOC_MATRIX_PROJECTION] != -1)
        rf_gfx_set_shader_value_matrix(material.shader, material.shader.locs[RF_LOC_MATRIX_PROJECTION],
                                       rf_ctx.projection);

    // At this point the rf_ctx->gl_ctx.modelview matrix just contains the view matrix (camera)
    // That's because rf_begin_mode3d() sets it an no model-drawing function modifies it, all use rf_gfx_push_matrix() and rf_gfx_pop_matrix()
    rf_mat mat_view = rf_ctx.modelview;         // View matrix (camera)
    rf_mat mat_projection = rf_ctx.projection;  // Projection matrix (perspective)

    // TODO: Consider possible transform matrices in the rf_ctx->gl_ctx.stack
    // Is this the right order? or should we start with the first stored matrix instead of the last one?
    //rf_mat matStackTransform = rf_mat_identity();
    //for (rf_int i = rf_ctx->gl_ctx.stack_counter; i > 0; i--) matStackTransform = rf_mat_mul(rf_ctx->gl_ctx.stack[i], matStackTransform);

    // rf_transform to camera-space coordinates
    rf_mat mat_model_view = rf_mat_mul(transform, rf_mat_mul(rf_ctx.transform, mat_view));
    //-----------------------------------------------------

    // Bind active texture maps (if available)
    for (rf_int i = 0; i < RF_MAX_MATERIAL_MAPS; i++)
    {
        if (material.maps[i].texture.id > 0)
        {
            rf_gl.ActiveTexture(GL_TEXTURE0 + i);
            if ((i == RF_MAP_IRRADIANCE) || (i == RF_MAP_PREFILTER) || (i == RF_MAP_CUBEMAP)) rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, material.maps[i].texture.id);
            else rf_gl.BindTexture(GL_TEXTURE_2D, material.maps[i].texture.id);

            rf_gl.Uniform1i(material.shader.locs[RF_LOC_MAP_DIFFUSE + i], i);
        }
    }

    // Bind vertex array objects (or VBOs)
    rf_gl.BindVertexArray(mesh.vao_id);

    rf_ctx.modelview = mat_model_view;

    // Calculate model-view-rf_ctx->gl_ctx.projection matrix (MVP)
    rf_mat mat_mvp = rf_mat_mul(rf_ctx.modelview, rf_ctx.projection); // rf_transform to screen-space coordinates

    // Send combined model-view-rf_ctx->gl_ctx.projection matrix to shader
    rf_gl.UniformMatrix4fv(material.shader.locs[RF_LOC_MATRIX_MVP], 1, false, rf_mat_to_float16(mat_mvp).v);

    // Draw call!
    if (mesh.indices != NULL) rf_gl.DrawElements(GL_TRIANGLES, mesh.triangle_count * 3, GL_UNSIGNED_SHORT, 0); // Indexed vertices draw
    else rf_gl.DrawArrays(GL_TRIANGLES, 0, mesh.vertex_count);

    // Unbind all binded texture maps
    for (rf_int i = 0; i < RF_MAX_MATERIAL_MAPS; i++)
    {
        rf_gl.ActiveTexture(GL_TEXTURE0 + i);       // Set shader active texture
        if ((i == RF_MAP_IRRADIANCE) || (i == RF_MAP_PREFILTER) || (i == RF_MAP_CUBEMAP)) rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, 0);
        else rf_gl.BindTexture(GL_TEXTURE_2D, 0);   // Unbind current active texture
    }

    // Unind vertex array objects (or VBOs)
    rf_gl.BindVertexArray(0);

    // Unbind shader program
    rf_gl.UseProgram(0);

    // Restore rf_ctx->gl_ctx.projection/rf_ctx->gl_ctx.modelview matrices
    // NOTE: In stereo rendering matrices are being modified to fit every eye
    rf_ctx.projection = mat_projection;
    rf_ctx.modelview = mat_view;
}